

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void sexp_make_unblocking(sexp_conflict ctx,sexp_conflict port)

{
  sexp psVar1;
  int iVar2;
  long lVar3;
  
  if ((((ulong)ctx & 3) == 0) && ((ctx->tag & 0xfffffffe) == 0x10)) {
    psVar1 = (ctx->value).type.getters;
    if (psVar1 == (sexp)0x0) {
      psVar1 = (ctx->value).type.slots;
      lVar3 = -1;
      if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
        lVar3 = (psVar1->value).fileno.fd;
      }
    }
    else {
      iVar2 = fileno((FILE *)psVar1);
      lVar3 = (long)iVar2;
    }
    if (-1 < lVar3) {
      if ((ctx->value).type.finalize_name == (sexp)0xffffffffffffffff) {
        psVar1 = (ctx->value).type.getters;
        if (psVar1 == (sexp)0x0) {
          psVar1 = (ctx->value).type.slots;
          iVar2 = -1;
          if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
            iVar2 = (psVar1->value).promise.donep;
          }
        }
        else {
          iVar2 = fileno((FILE *)psVar1);
        }
        iVar2 = fcntl(iVar2,3);
        *(long *)((long)&ctx->value + 0x40) = (long)iVar2;
      }
      if (((ctx->value).flonum_bits[0x41] & 8U) == 0) {
        psVar1 = (ctx->value).type.getters;
        if (psVar1 == (sexp)0x0) {
          psVar1 = (ctx->value).type.slots;
          iVar2 = -1;
          if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
            iVar2 = (psVar1->value).promise.donep;
          }
        }
        else {
          iVar2 = fileno((FILE *)psVar1);
        }
        iVar2 = fcntl(iVar2,4,(ctx->value).port.flags | 0x800);
        if (iVar2 == 0) {
          (ctx->value).flonum_bits[0x41] = (ctx->value).flonum_bits[0x41] | 8;
        }
      }
    }
  }
  return;
}

Assistant:

static void sexp_make_unblocking (sexp ctx, sexp port) {
  if (!(sexp_portp(port) && sexp_port_fileno(port) >= 0))
    return;
  if (sexp_port_flags(port) == SEXP_PORT_UNKNOWN_FLAGS)
    sexp_port_flags(port) = fcntl(sexp_port_fileno(port), F_GETFL);
  if (!(sexp_port_flags(port) & O_NONBLOCK))
    if (fcntl(sexp_port_fileno(port), F_SETFL, sexp_port_flags(port) | O_NONBLOCK) == 0)
      sexp_port_flags(port) |= O_NONBLOCK;
}